

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

int archive_write_shar_free(archive_write *a)

{
  void *__ptr;
  long in_RDI;
  shar *shar;
  
  __ptr = *(void **)(in_RDI + 0xd0);
  if (__ptr != (void *)0x0) {
    archive_entry_free((archive_entry *)0x195327);
    free(*(void **)((long)__ptr + 0x18));
    archive_string_free((archive_string *)0x195341);
    archive_string_free((archive_string *)0x19534e);
    free(__ptr);
    *(undefined8 *)(in_RDI + 0xd0) = 0;
  }
  return 0;
}

Assistant:

static int
archive_write_shar_free(struct archive_write *a)
{
	struct shar *shar;

	shar = (struct shar *)a->format_data;
	if (shar == NULL)
		return (ARCHIVE_OK);

	archive_entry_free(shar->entry);
	free(shar->last_dir);
	archive_string_free(&(shar->work));
	archive_string_free(&(shar->quoted_name));
	free(shar);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}